

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

string * __thiscall
slang::ast::getLexicalPath_abi_cxx11_(string *__return_storage_ptr__,ast *this,Scope *scope)

{
  Symbol *pSVar1;
  Symbol *sym;
  allocator<char> local_19;
  Scope *local_18;
  Scope *scope_local;
  string *str;
  
  local_18 = (Scope *)this;
  scope_local = (Scope *)__return_storage_ptr__;
  if ((this == (ast *)0x0) ||
     (pSVar1 = Scope::asSymbol((Scope *)this), pSVar1->kind == CompilationUnit)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    pSVar1 = Scope::asSymbol(local_18);
    Symbol::getLexicalPath(pSVar1,__return_storage_ptr__);
    if (((pSVar1->kind == Package) || (pSVar1->kind == ClassType)) ||
       (pSVar1->kind == CovergroupType)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLexicalPath(const Scope* scope) {
    if (!scope || scope->asSymbol().kind == SymbolKind::CompilationUnit)
        return "";

    std::string str;
    auto& sym = scope->asSymbol();
    sym.getLexicalPath(str);

    if (sym.kind == SymbolKind::Package || sym.kind == SymbolKind::ClassType ||
        sym.kind == SymbolKind::CovergroupType) {
        str.append("::");
    }
    else {
        str.push_back('.');
    }

    return str;
}